

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::maxInt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  if (((this->type).id == 2) && ((other->type).id == 2)) {
    if ((other->field_0).i32 < (this->field_0).i32) {
      other = this;
    }
    Literal(__return_storage_ptr__,other);
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

Literal Literal::maxInt(const Literal& other) const {
  return geti32() > other.geti32() ? *this : other;
}